

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_make_hist(fitsfile *fptr,fitsfile *histptr,int bitpix,int naxis,long *naxes,int *colnum,
                  float *amin,float *amax,float *binsize,float weight,int wtcolnum,int recip,
                  char *selectrow,int *status)

{
  int in_ECX;
  undefined4 in_EDX;
  int *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  float in_XMM0_Da;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  int *in_stack_00000038;
  int naxis1;
  int i;
  double weightd;
  double binsized [4];
  double amaxd [4];
  double amind [4];
  int local_c8;
  int local_c4;
  int *in_stack_ffffffffffffff48;
  long *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  fitsfile *in_stack_ffffffffffffff60;
  fitsfile *in_stack_ffffffffffffff68;
  double local_78 [3];
  double *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  
  if (*in_stack_00000038 == 0) {
    local_c8 = 4;
    if (in_ECX < 4) {
      local_c8 = in_ECX;
    }
    for (local_c4 = 0; local_c4 < local_c8; local_c4 = local_c4 + 1) {
      local_78[local_c4] = (double)*(float *)(in_stack_00000008 + (long)local_c4 * 4);
      local_78[(long)local_c4 + -4] = (double)*(float *)(in_stack_00000010 + (long)local_c4 * 4);
      *(double *)(&stack0xffffffffffffff48 + (long)local_c4 * 8) =
           (double)*(float *)(in_stack_00000018 + (long)local_c4 * 4);
    }
    fits_make_histd(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                    in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                    in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                    (double *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffb0),(double)in_XMM0_Da,
                    (int)in_R9,(int)in_R8,(char *)CONCAT44(in_EDX,in_ECX),in_RSI);
  }
  return *in_stack_00000038;
}

Assistant:

int fits_make_hist(fitsfile *fptr, /* IO - pointer to table with X and Y cols; */
    fitsfile *histptr, /* I - pointer to output FITS image      */
    int bitpix,       /* I - datatype for image: 16, 32, -32, etc    */
    int naxis,        /* I - number of axes in the histogram image   */
    long *naxes,      /* I - size of axes in the histogram image   */
    int *colnum,    /* I - column numbers (array length = naxis)   */
    float *amin,     /* I - minimum histogram value, for each axis */
    float *amax,     /* I - maximum histogram value, for each axis */
    float *binsize, /* I - bin size along each axis               */
    float weight,        /* I - binning weighting factor          */
    int wtcolnum, /* I - optional keyword or col for weight*/
    int recip,              /* I - use reciprocal of the weight?     */
    char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
    int *status)
{		  
  double amind[4], amaxd[4], binsized[4], weightd;

  /* Copy single precision values into double precision */
  if (*status == 0) {
    int i, naxis1 = 4;
    if (naxis < naxis1) naxis1 = naxis;
    for (i=0; i<naxis1; i++) {
      amind[i] = (double) amin[i];
      amaxd[i] = (double) amax[i];
      binsized[i] = (double) binsize[i];
    }

    weightd = (double) weight;

    fits_make_histd(fptr, histptr, bitpix, naxis, naxes, colnum,
		    amind, amaxd, binsized, weight, wtcolnum, recip,
		    selectrow, status);
  }

  return (*status);
}